

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pathtracer.cpp
# Opt level: O2

Vector3D * __thiscall
CGL::PathTracer::one_bounce_radiance
          (Vector3D *__return_storage_ptr__,PathTracer *this,Ray *r,Intersection *isect)

{
  if (this->direct_hemisphere_sample == true) {
    estimate_direct_lighting_hemisphere(__return_storage_ptr__,this,r,isect);
  }
  else {
    estimate_direct_lighting_importance(__return_storage_ptr__,this,r,isect);
  }
  return __return_storage_ptr__;
}

Assistant:

Vector3D PathTracer::one_bounce_radiance(const Ray &r,
                                         const Intersection &isect) {
  // TODO: Part 3, Task 3
  // Returns either the direct illumination by hemisphere or importance sampling
  // depending on `direct_hemisphere_sample`
  if (direct_hemisphere_sample) {
    return estimate_direct_lighting_hemisphere(r, isect);
  }

  return estimate_direct_lighting_importance(r, isect);
}